

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QMimeMagicRule>::moveAppend
          (QGenericArrayOps<QMimeMagicRule> *this,QMimeMagicRule *b,QMimeMagicRule *e)

{
  QMimeMagicRule *pQVar1;
  Data *pDVar2;
  QMimeMagicRule *pQVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char *pcVar6;
  MatchFunction MVar7;
  int iVar8;
  quint32 qVar9;
  qsizetype qVar10;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QMimeMagicRule>).ptr;
    qVar10 = (this->super_QArrayDataPointer<QMimeMagicRule>).size;
    do {
      pDVar2 = (b->m_subMatches).d.d;
      (b->m_subMatches).d.d = (Data *)0x0;
      pQVar1[qVar10].m_subMatches.d.d = pDVar2;
      pQVar3 = (b->m_subMatches).d.ptr;
      (b->m_subMatches).d.ptr = (QMimeMagicRule *)0x0;
      pQVar1[qVar10].m_subMatches.d.ptr = pQVar3;
      qVar4 = (b->m_subMatches).d.size;
      (b->m_subMatches).d.size = 0;
      pQVar1[qVar10].m_subMatches.d.size = qVar4;
      pQVar1[qVar10].m_type = b->m_type;
      pDVar5 = (b->m_value).d.d;
      (b->m_value).d.d = (Data *)0x0;
      pQVar1[qVar10].m_value.d.d = pDVar5;
      pcVar6 = (b->m_value).d.ptr;
      (b->m_value).d.ptr = (char *)0x0;
      pQVar1[qVar10].m_value.d.ptr = pcVar6;
      qVar4 = (b->m_value).d.size;
      (b->m_value).d.size = 0;
      pQVar1[qVar10].m_value.d.size = qVar4;
      iVar8 = b->m_endPos;
      pQVar1[qVar10].m_startPos = b->m_startPos;
      pQVar1[qVar10].m_endPos = iVar8;
      pDVar5 = (b->m_mask).d.d;
      (b->m_mask).d.d = (Data *)0x0;
      pQVar1[qVar10].m_mask.d.d = pDVar5;
      pcVar6 = (b->m_mask).d.ptr;
      (b->m_mask).d.ptr = (char *)0x0;
      pQVar1[qVar10].m_mask.d.ptr = pcVar6;
      qVar4 = (b->m_mask).d.size;
      (b->m_mask).d.size = 0;
      pQVar1[qVar10].m_mask.d.size = qVar4;
      pDVar5 = (b->m_pattern).d.d;
      (b->m_pattern).d.d = (Data *)0x0;
      pQVar1[qVar10].m_pattern.d.d = pDVar5;
      pcVar6 = (b->m_pattern).d.ptr;
      (b->m_pattern).d.ptr = (char *)0x0;
      pQVar1[qVar10].m_pattern.d.ptr = pcVar6;
      qVar4 = (b->m_pattern).d.size;
      (b->m_pattern).d.size = 0;
      pQVar1[qVar10].m_pattern.d.size = qVar4;
      qVar9 = b->m_numberMask;
      MVar7 = b->m_matchFunction;
      pQVar3 = pQVar1 + qVar10;
      pQVar3->m_number = b->m_number;
      pQVar3->m_numberMask = qVar9;
      *(MatchFunction *)(&pQVar3->m_number + 2) = MVar7;
      *(undefined8 *)&pQVar1[qVar10].field_0x80 = *(undefined8 *)&b->field_0x80;
      b = b + 1;
      qVar10 = (this->super_QArrayDataPointer<QMimeMagicRule>).size + 1;
      (this->super_QArrayDataPointer<QMimeMagicRule>).size = qVar10;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }